

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O2

void Curl_dynhds_free(dynhds *dynhds)

{
  ulong uVar1;
  dynhds_entry **ppdVar2;
  size_t i;
  ulong uVar3;
  
  ppdVar2 = dynhds->hds;
  if (ppdVar2 == (dynhds_entry **)0x0) {
    ppdVar2 = (dynhds_entry **)0x0;
  }
  else {
    uVar1 = dynhds->hds_len;
    if (uVar1 != 0) {
      for (uVar3 = 0; ppdVar2 = dynhds->hds, uVar3 < uVar1; uVar3 = uVar3 + 1) {
        (*Curl_cfree)(ppdVar2[uVar3]);
        uVar1 = dynhds->hds_len;
      }
    }
  }
  (*Curl_cfree)(ppdVar2);
  dynhds->strs_len = 0;
  dynhds->hds = (dynhds_entry **)0x0;
  dynhds->hds_len = 0;
  dynhds->hds_allc = 0;
  return;
}

Assistant:

void Curl_dynhds_free(struct dynhds *dynhds)
{
  DEBUGASSERT(dynhds);
  if(dynhds->hds && dynhds->hds_len) {
    size_t i;
    DEBUGASSERT(dynhds->hds);
    for(i = 0; i < dynhds->hds_len; ++i) {
      entry_free(dynhds->hds[i]);
    }
  }
  Curl_safefree(dynhds->hds);
  dynhds->hds_len = dynhds->hds_allc = dynhds->strs_len = 0;
}